

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void perform_gamma_composition_tests(png_modifier *pm,int do_background,int expand_16)

{
  undefined4 uVar1;
  png_byte colour_typeIn;
  png_byte pVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  png_uint_32 r;
  int iVar6;
  png_uint_32 pVar7;
  size_t sVar8;
  ulong uVar9;
  uint expand16In;
  long lVar10;
  ushort *puVar11;
  ulong uVar12;
  undefined4 in_register_00000034;
  bool bVar13;
  bool bVar14;
  undefined2 uStack_108;
  png_byte bit_depth;
  png_byte colour_type;
  undefined1 local_102;
  undefined1 uStack_101;
  undefined2 local_100;
  undefined2 local_fe;
  undefined4 local_fc;
  byte local_f7;
  char local_f6;
  char local_f5;
  uint palette_number;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined8 local_d8;
  ulong local_d0;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  char name [128];
  
  local_d8 = CONCAT44(in_register_00000034,do_background);
  colour_type = '\0';
  bit_depth = '\0';
  palette_number = 0;
  iVar6 = next_format(&colour_type,&bit_depth,&palette_number,(uint)::pm._1596_4_ >> 0x1e & 1,
                      (uint)::pm._1596_4_ >> 0xc & 1);
  if (iVar6 != 0) {
    expand16In = (uint)pm;
    local_f6 = (expand16In & 0xfffffffe) == 2 && (int)local_d8 != 0;
    local_c0 = (ulong)(expand16In - 1);
    do {
      pVar2 = colour_type;
      colour_typeIn = bit_depth;
      if ((((colour_type & 4) != 0) || ((colour_type != '\x03' && (palette_number != 0)))) &&
         (bVar13 = ::pm.ngamma_tests != 0, bVar13)) {
        local_c4 = palette_number;
        local_f5 = bit_depth == '\x10' || (int)local_d8 != 0;
        local_c8 = ~(-1 << (bit_depth & 0x1f));
        local_d0 = 0;
        do {
          local_f7 = bVar13;
          if (::pm.ngamma_tests != 0) {
            uVar12 = 0;
            do {
              uVar1 = ::pm._1596_4_;
              local_e0 = 1.0 / ::pm.gammas[local_d0];
              local_f0 = ::pm.gammas[uVar12];
              if ((uint)local_c0 < 7) {
                (*(code *)(&DAT_00115220 + *(int *)(&DAT_00115220 + local_c0 * 4)))();
                return;
              }
              local_e8 = 4.0;
              pVar7 = random_32();
              local_100 = (ushort)pVar7;
              local_fe = (ushort)(pVar7 >> 0x10);
              if (local_f5 == '\0') {
                local_100 = local_100 & 0xff;
                uVar4 = local_fe & 0xff;
                uVar5 = (ushort)(byte)(pVar7 >> 0x18);
                local_fe = (ushort)(pVar7 >> 8) & 0xff;
LAB_00111528:
                local_fc = CONCAT22(uVar5,uVar4);
              }
              else {
                local_fc = random_32();
                if ((local_f6 != '\0') && (0.05 < ABS(local_e8 * local_f0 + -1.0))) {
                  local_100 = CONCAT11(local_100._1_1_,local_100._1_1_);
                  uVar4 = (ushort)local_fc & 0xff00 | (ushort)(local_fc >> 8) & 0xff;
                  uVar5 = (ushort)(local_fc >> 0x10) & 0xff00 | (ushort)(byte)(local_fc >> 0x18);
                  local_fe = CONCAT11(local_fe._1_1_,local_fe._1_1_);
                  goto LAB_00111528;
                }
              }
              local_102 = 0xc1;
              if ((pVar2 & 2) == 0) {
                if (colour_typeIn < 8) {
                  local_fc = (uint)(local_fc._2_2_ & (ushort)local_c8) << 0x10;
                }
                local_fc = CONCAT22(local_fc._2_2_,local_fc._2_2_);
                local_fe = local_fc._2_2_;
                local_100 = local_fc._2_2_;
              }
              cVar3 = 'g';
              lVar10 = 0;
              do {
                name[lVar10] = cVar3;
                cVar3 = "gamma "[lVar10 + 1];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 6);
              name[6] = '\0';
              sVar8 = safecatd(name,0x80,6,local_e0,3);
              bVar13 = sVar8 < 0x80;
              if (bVar13) {
                cVar3 = '-';
                lVar10 = 0;
                do {
                  uVar9 = sVar8;
                  name[uVar9] = cVar3;
                  if (uVar9 == 0x7f) {
                    sVar8 = 0x80;
                    break;
                  }
                  cVar3 = "->"[lVar10 + 1];
                  lVar10 = lVar10 + 1;
                  sVar8 = uVar9 + 1;
                } while (lVar10 != 2);
                bVar13 = uVar9 < 0x7f;
              }
              if (!bVar13) {
                sVar8 = 0x7f;
              }
              name[sVar8] = '\0';
              sVar8 = safecatd(name,0x80,sVar8,local_f0,3);
              if (0x7f < sVar8) {
                sVar8 = 0x7f;
              }
              name[sVar8] = '\0';
              if ((int)expand16In < 4) {
                bVar14 = sVar8 != 0x7f;
                bVar13 = sVar8 < 0x80;
                if (sVar8 < 0x80) {
                  name[sVar8] = '(';
                  sVar8 = sVar8 + 1;
                  bVar13 = bVar14;
                }
                if (!bVar13) {
                  sVar8 = 0x7f;
                }
                name[sVar8] = '\0';
                if ((pVar2 & 2) == 0) {
                  puVar11 = (ushort *)((long)&local_fc + 2);
                }
                else {
                  sVar8 = safecatn(name,0x80,sVar8,(uint)local_100);
                  bVar14 = sVar8 != 0x7f;
                  bVar13 = sVar8 < 0x80;
                  if (sVar8 < 0x80) {
                    name[sVar8] = ',';
                    sVar8 = sVar8 + 1;
                    bVar13 = bVar14;
                  }
                  if (!bVar13) {
                    sVar8 = 0x7f;
                  }
                  name[sVar8] = '\0';
                  sVar8 = safecatn(name,0x80,sVar8,(uint)local_fe);
                  bVar14 = sVar8 != 0x7f;
                  bVar13 = sVar8 < 0x80;
                  if (sVar8 < 0x80) {
                    name[sVar8] = ',';
                    sVar8 = sVar8 + 1;
                    bVar13 = bVar14;
                  }
                  if (!bVar13) {
                    sVar8 = 0x7f;
                  }
                  name[sVar8] = '\0';
                  puVar11 = (ushort *)&local_fc;
                }
                sVar8 = safecatn(name,0x80,sVar8,(uint)*puVar11);
                bVar13 = sVar8 < 0x80;
                if (bVar13) {
                  cVar3 = ')';
                  lVar10 = 0;
                  do {
                    uVar9 = sVar8;
                    name[uVar9] = cVar3;
                    if (uVar9 == 0x7f) {
                      sVar8 = 0x80;
                      break;
                    }
                    cVar3 = ")^"[lVar10 + 1];
                    lVar10 = lVar10 + 1;
                    sVar8 = uVar9 + 1;
                  } while (lVar10 != 2);
                  bVar13 = uVar9 < 0x7f;
                }
                if (!bVar13) {
                  sVar8 = 0x7f;
                }
                name[sVar8] = '\0';
                safecatd(name,0x80,sVar8,local_e8,3);
              }
              gamma_test((png_modifier *)(ulong)pVar2,colour_typeIn,(png_byte)local_c4,
                         (int)(uVar1 << 0x17) >> 0x17,0,local_e0,local_f0,'\0',(int)name,
                         (char *)(ulong)((uint)uVar1 >> 0xd & 1),0,(int)local_d8,expand16In,
                         (int)&local_102,
                         (png_color_16 *)
                         CONCAT17(uStack_101,
                                  CONCAT16(local_102,
                                           CONCAT15(colour_type,
                                                    CONCAT14(bit_depth,
                                                             CONCAT13(colour_typeIn,
                                                                      CONCAT12(pVar2,uStack_108)))))
                                 ),local_e8);
              if (((-1 < (int)::pm._1596_4_) && ((::pm.this._24_1_ & 1) == 0)) &&
                 ((0 < ::pm.this.nerrors ||
                  (((::pm.this._24_1_ & 2) != 0 && (0 < ::pm.this.nwarnings)))))) {
                if ((local_f7 & 1) != 0) {
                  return;
                }
                goto LAB_00111874;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < ::pm.ngamma_tests);
          }
          local_d0 = local_d0 + 1;
          bVar13 = local_d0 < ::pm.ngamma_tests;
        } while (bVar13);
      }
LAB_00111874:
      iVar6 = next_format(&colour_type,&bit_depth,&palette_number,(uint)::pm._1596_4_ >> 0x1e & 1,
                          (uint)::pm._1596_4_ >> 0xc & 1);
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

static void
perform_gamma_composition_tests(png_modifier *pm, int do_background,
   int expand_16)
{
   png_byte colour_type = 0;
   png_byte bit_depth = 0;
   unsigned int palette_number = 0;

   /* Skip the non-alpha cases - there is no setting of a transparency colour at
    * present.
    *
    * TODO: incorrect; the palette case sets tRNS and, now RGB and gray do,
    * however the palette case fails miserably so is commented out below.
    */
   while (next_format(&colour_type, &bit_depth, &palette_number,
                      pm->test_lbg_gamma_composition, pm->test_tRNS))
      if ((colour_type & PNG_COLOR_MASK_ALPHA) != 0
#if 0 /* TODO: FIXME */
          /*TODO: FIXME: this should work */
          || colour_type == 3
#endif
          || (colour_type != 3 && palette_number != 0))
   {
      unsigned int i, j;

      /* Don't skip the i==j case here - it's relevant. */
      for (i=0; i<pm->ngamma_tests; ++i)
      {
         for (j=0; j<pm->ngamma_tests; ++j)
         {
            gamma_composition_test(pm, colour_type, bit_depth, palette_number,
               pm->interlace_type, 1/pm->gammas[i], pm->gammas[j],
               pm->use_input_precision, do_background, expand_16);

            if (fail(pm))
               return;
         }
      }
   }
}